

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::MultiPortSymbol::MultiPortSymbol
          (MultiPortSymbol *this,string_view name,SourceLocation loc,
          span<const_slang::ast::PortSymbol_*const,_18446744073709551615UL> ports,
          ArgumentDirection direction)

{
  (this->super_Symbol).kind = MultiPort;
  (this->super_Symbol).name._M_len = name._M_len;
  (this->super_Symbol).name._M_str = name._M_str;
  (this->super_Symbol).location = loc;
  (this->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (this->super_Symbol).parentScope = (Scope *)0x0;
  (this->super_Symbol).nextInScope = (Symbol *)0x0;
  (this->super_Symbol).indexInScope = 0;
  (this->ports)._M_ptr = ports._M_ptr;
  (this->ports)._M_extent._M_extent_value = ports._M_extent._M_extent_value._M_extent_value;
  this->direction = direction;
  this->isNullPort = false;
  this->type = (Type *)0x0;
  return;
}

Assistant:

MultiPortSymbol::MultiPortSymbol(std::string_view name, SourceLocation loc,
                                 std::span<const PortSymbol* const> ports,
                                 ArgumentDirection direction) :
    Symbol(SymbolKind::MultiPort, name, loc), ports(ports), direction(direction) {
}